

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_involve::preprocess
          (method_involve *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  bool bVar1;
  const_reference pptVar2;
  token_base **pptVar3;
  element_type *this_00;
  var *this_01;
  undefined8 uVar4;
  token_base *ptr;
  context_t *c;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *this_02;
  anon_union_8_1_a8a14541_for_iterator_1 this_03;
  long in_RDI;
  iterator iVar5;
  value_type *it;
  const_iterator __end3;
  const_iterator __begin3;
  domain_type *__range3;
  domain_type *domain;
  var ns;
  token_value *vptr;
  tree_type<cs::token_base_*> *tree;
  string *in_stack_fffffffffffffe48;
  domain_type *in_stack_fffffffffffffe50;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *this_04;
  type_info *in_stack_fffffffffffffe58;
  type_info *in_stack_fffffffffffffe60;
  token_base *in_stack_fffffffffffffe70;
  context_t *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  undefined1 uVar6;
  domain_type *in_stack_fffffffffffffe88;
  allocator *paVar7;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  anon_union_8_1_a8a14541_for_iterator_1 local_150;
  string *name;
  any *in_stack_fffffffffffffed0;
  token_value *local_110;
  undefined1 local_f0 [80];
  string local_a0 [32];
  reference local_80;
  iterator local_78;
  iterator local_68;
  domain_type *local_58;
  domain_type *local_50;
  tree_node *local_30;
  token_value *local_28;
  tree_type<cs::token_base_*> *local_20;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffe60);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
  local_20 = token_expr::get_tree((token_expr *)*pptVar2);
  local_30 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe48);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data
                      ((iterator *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90));
  if (*pptVar3 == (token_base *)0x0) {
    local_110 = (token_value *)0x0;
  }
  else {
    local_110 = (token_value *)
                __dynamic_cast(*pptVar3,&token_base::typeinfo,&token_value::typeinfo,0);
  }
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffffe80 >> 0x38);
  local_28 = local_110;
  if (local_110 == (token_value *)0x0) {
    this_02 = (deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
              statement_base::operator_new((size_t)in_stack_fffffffffffffe50);
    tree_type<cs::token_base_*>::tree_type
              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe50,
               (tree_type<cs::token_base_*> *)in_stack_fffffffffffffe48);
    this_04 = (deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)local_f0;
    std::shared_ptr<cs::context_type>::shared_ptr
              ((shared_ptr<cs::context_type> *)this_04,
               (shared_ptr<cs::context_type> *)in_stack_fffffffffffffe48);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)this_02);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(this_02);
    statement_involve::statement_involve
              ((statement_involve *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (tree_type<cs::token_base_*> *)in_stack_fffffffffffffe88,(bool)uVar6,
               in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    local_f0._24_8_ = this_02;
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    emplace_back<cs::statement_involve*>(this_04,(statement_involve **)in_stack_fffffffffffffe48);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x5625e4);
    tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x5625f1);
  }
  else {
    token_value::get_value(local_110);
    cs_impl::any::any((any *)in_stack_fffffffffffffe50,(any *)in_stack_fffffffffffffe48);
    cs_impl::any::type((any *)in_stack_fffffffffffffe50);
    bVar1 = std::type_info::operator==(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    if (!bVar1) {
      local_f0[0x4e] = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      paVar7 = (allocator *)(local_f0 + 0x4f);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a0,"Only support involve namespace.",paVar7);
      compile_error::compile_error
                ((compile_error *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      local_f0[0x4e] = 0;
      __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
    }
    cs_impl::any::const_val<std::shared_ptr<cs::name_space>>(in_stack_fffffffffffffed0);
    this_00 = std::__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cs::name_space,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x56213d);
    local_58 = name_space::get_domain(this_00);
    local_50 = local_58;
    local_68 = (iterator)domain_type::begin_abi_cxx11_((domain_type *)0x56217c);
    this_03 = local_68.field_1;
    iVar5 = (iterator)domain_type::end_abi_cxx11_((domain_type *)0x5621b5);
    local_78 = iVar5;
    while( true ) {
      local_150 = iVar5.field_1;
      name = (string *)iVar5.ctrl_;
      bVar1 = phmap::priv::operator!=
                        ((const_iterator *)in_stack_fffffffffffffe50,
                         (const_iterator *)in_stack_fffffffffffffe48);
      uVar6 = (undefined1)((ulong)in_stack_fffffffffffffe80 >> 0x38);
      if (!bVar1) break;
      local_80 = phmap::priv::
                 raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::const_iterator::operator*((const_iterator *)0x562210);
      this_01 = domain_type::get_var_by_id
                          (in_stack_fffffffffffffe50,(size_t)in_stack_fffffffffffffe48);
      in_stack_fffffffffffffe97 = cs_impl::any::is_protect(this_01);
      if ((bool)in_stack_fffffffffffffe97) {
        std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x56226b);
        std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x562277);
        domain_manager::add_record((domain_manager *)this_03.slot_,name);
      }
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
      ::const_iterator::operator++((const_iterator *)in_stack_fffffffffffffe50);
      iVar5.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_1)
           (anon_union_8_1_a8a14541_for_iterator_1)local_150.slot_;
      iVar5.ctrl_ = (ctrl_t *)name;
    }
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5622cb);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x5622d7);
    domain_manager::involve_domain
              ((domain_manager *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88,(bool)uVar6);
    ptr = (token_base *)(in_RDI + 8);
    c = (context_t *)statement_base::operator_new((size_t)in_stack_fffffffffffffe50);
    local_f0[0x27] = 1;
    tree_type<cs::token_base_*>::tree_type
              ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe50,
               (tree_type<cs::token_base_*> *)in_stack_fffffffffffffe48);
    std::shared_ptr<cs::context_type>::shared_ptr
              ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffe50,
               (shared_ptr<cs::context_type> *)in_stack_fffffffffffffe48);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)in_stack_fffffffffffffe60);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
               in_stack_fffffffffffffe60);
    statement_involve::statement_involve
              ((statement_involve *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               (tree_type<cs::token_base_*> *)in_stack_fffffffffffffe88,(bool)uVar6,c,ptr);
    local_f0[0x27] = 0;
    local_f0._64_8_ = c;
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    emplace_back<cs::statement_involve*>
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffe50,(statement_involve **)in_stack_fffffffffffffe48);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x562495);
    tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x5624a2);
    cs_impl::any::~any((any *)0x5624af);
  }
  return;
}

Assistant:

void method_involve::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		token_value *vptr = dynamic_cast<token_value *>(tree.root().data());
		if (vptr != nullptr) {
			var ns = vptr->get_value();
			if (ns.type() == typeid(namespace_t)) {
				auto &domain = ns.const_val<namespace_t>()->get_domain();
				for (auto &it: domain) {
					if (domain.get_var_by_id(it.second).is_protect())
						context->instance->storage.add_record(it.first);
				}
				context->instance->storage.involve_domain(domain);
			}
			else
				throw compile_error("Only support involve namespace.");
			mResult.emplace_back(new statement_involve(tree, true, context, raw.front().back()));
		}
		else
			mResult.emplace_back(new statement_involve(tree, false, context, raw.front().back()));
	}